

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

TriggerStep * sqlite3TriggerSelectStep(sqlite3 *db,Select *pSelect,char *zStart,char *zEnd)

{
  TriggerStep *pTVar1;
  char *pcVar2;
  
  pTVar1 = (TriggerStep *)sqlite3DbMallocZero(db,0x58);
  if (pTVar1 == (TriggerStep *)0x0) {
    if (pSelect != (Select *)0x0) {
      clearSelect(db,pSelect,1);
    }
    pTVar1 = (TriggerStep *)0x0;
  }
  else {
    pTVar1->op = 0x83;
    pTVar1->orconf = '\v';
    pTVar1->pSelect = pSelect;
    pcVar2 = triggerSpanDup(db,zStart,zEnd);
    pTVar1->zSpan = pcVar2;
  }
  return pTVar1;
}

Assistant:

SQLITE_PRIVATE TriggerStep *sqlite3TriggerSelectStep(
  sqlite3 *db,                /* Database connection */
  Select *pSelect,            /* The SELECT statement */
  const char *zStart,         /* Start of SQL text */
  const char *zEnd            /* End of SQL text */
){
  TriggerStep *pTriggerStep = sqlite3DbMallocZero(db, sizeof(TriggerStep));
  if( pTriggerStep==0 ) {
    sqlite3SelectDelete(db, pSelect);
    return 0;
  }
  pTriggerStep->op = TK_SELECT;
  pTriggerStep->pSelect = pSelect;
  pTriggerStep->orconf = OE_Default;
  pTriggerStep->zSpan = triggerSpanDup(db, zStart, zEnd);
  return pTriggerStep;
}